

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  ulong i;
  int iVar8;
  ulong uVar9;
  uint i_00;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  undefined4 uVar14;
  byte *pbVar15;
  byte *pbVar16;
  bool bVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pbVar3 = (byte *)is->src_;
  bVar2 = *pbVar3;
  pbVar16 = pbVar3;
  bVar7 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar16 = pbVar3 + 1;
    bVar7 = pbVar3[1];
  }
  pCVar4 = is->head_;
  uVar14 = 0xd;
  if (bVar7 == 0x30) {
    bVar7 = pbVar16[1];
    pbVar15 = pbVar16 + 1;
    uVar9 = 0;
    i_00 = 0;
LAB_00107f4c:
    uVar11 = (uint)bVar7;
    bVar17 = false;
    bVar6 = false;
    i = 0;
    dVar18 = 0.0;
    bVar5 = false;
    goto LAB_0010801a;
  }
  if ((byte)(bVar7 - 0x31) < 9) {
    i_00 = bVar7 - 0x30;
    uVar9 = 0;
    if (bVar2 == 0x2d) {
LAB_00107e5b:
      bVar7 = pbVar16[uVar9 + 1];
      uVar12 = (ulong)bVar7;
      if (9 < (byte)(bVar7 - 0x30)) goto LAB_00107f3b;
      if (i_00 < 0xccccccc) {
LAB_00107e74:
        i_00 = (i_00 * 10 + (uint)bVar7) - 0x30;
        uVar9 = uVar9 + 1;
        goto LAB_00107e5b;
      }
      uVar11 = i_00;
      if (i_00 != 0xccccccc) goto LAB_00107ee2;
      if (bVar7 < 0x39) goto LAB_00107e74;
      uVar12 = 0x39;
      uVar11 = 0xccccccc;
LAB_00107ee2:
      i_00 = uVar11;
      pbVar15 = pbVar16 + uVar9 + 1;
      i = (ulong)i_00;
      if (bVar2 == 0x2d) {
        while( true ) {
          uVar11 = (uint)uVar12;
          if (9 < (byte)((byte)uVar12 - 0x30)) break;
          if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar12 || i != 0xccccccccccccccc))
          goto LAB_00107fa3;
          i = (uVar12 & 0xf) + i * 10;
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar12 = (ulong)pbVar15[1];
          pbVar15 = pbVar15 + 1;
        }
      }
      else {
        while( true ) {
          uVar11 = (uint)uVar12;
          if (9 < (byte)((byte)uVar12 - 0x30)) break;
          if ((0x1999999999999998 < i) && (0x35 < (byte)uVar12 || i != 0x1999999999999999))
          goto LAB_00107fa3;
          i = (uVar12 & 0xf) + i * 10;
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar12 = (ulong)pbVar15[1];
          pbVar15 = pbVar15 + 1;
        }
      }
      dVar18 = 0.0;
      bVar5 = true;
      bVar17 = false;
      bVar6 = false;
      goto LAB_0010801a;
    }
    while( true ) {
      bVar7 = pbVar16[uVar9 + 1];
      uVar12 = (ulong)bVar7;
      if (9 < (byte)(bVar7 - 0x30)) break;
      if ((0x19999998 < i_00) &&
         ((uVar11 = i_00, i_00 != 0x19999999 || (uVar11 = 0x19999999, 0x35 < bVar7))))
      goto LAB_00107ee2;
      i_00 = (i_00 * 10 + (uint)bVar7) - 0x30;
      uVar9 = uVar9 + 1;
    }
LAB_00107f3b:
    pbVar15 = pbVar16 + uVar9 + 1;
    goto LAB_00107f4c;
  }
  uVar14 = 3;
  pbVar15 = pbVar16;
  goto LAB_0010823e;
LAB_00107fa3:
  auVar19._8_4_ = (int)(i >> 0x20);
  auVar19._0_8_ = i;
  auVar19._12_4_ = 0x45300000;
  dVar18 = (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while (uVar11 = (uint)uVar12, (byte)((char)uVar12 - 0x30U) < 10) {
    pbVar16 = pbVar3;
    if (1.7976931348623158e+307 <= dVar18) goto LAB_0010823e;
    dVar18 = dVar18 * 10.0 + (double)(int)(uVar11 - 0x30);
    pbVar16 = pbVar15 + 1;
    pbVar15 = pbVar15 + 1;
    uVar12 = (ulong)*pbVar16;
  }
  bVar17 = true;
  bVar6 = true;
  bVar5 = true;
LAB_0010801a:
  if ((char)uVar11 == '.') {
    pbVar16 = pbVar15 + 1;
    uVar11 = (uint)*pbVar16;
    pbVar15 = pbVar15 + 1;
    if ((byte)(*pbVar16 - 0x3a) < 0xf6) {
      uVar14 = 0xe;
      pbVar16 = pbVar15;
    }
    else {
      iVar13 = 0;
      if (!bVar17) {
        if (!bVar5) {
          i = (ulong)i_00;
        }
        iVar13 = 0;
        while ((('/' < (char)(byte)uVar11 && ((byte)uVar11 < 0x3a)) && (i >> 0x35 == 0))) {
          pbVar16 = pbVar15 + 1;
          pbVar15 = pbVar15 + 1;
          iVar13 = iVar13 + -1;
          i = (ulong)(uVar11 - 0x30) + i * 10;
          uVar9 = (ulong)((int)uVar9 + (uint)(i != 0));
          uVar11 = (uint)*pbVar16;
        }
        auVar20._8_4_ = (int)(i >> 0x20);
        auVar20._0_8_ = i;
        auVar20._12_4_ = 0x45300000;
        dVar18 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
        bVar6 = true;
      }
      while ('/' < (char)(byte)uVar11) {
        if (0x39 < (byte)uVar11) goto LAB_0010814d;
        if ((int)uVar9 < 0x11) {
          dVar18 = dVar18 * 10.0 + (double)(int)(uVar11 - 0x30);
          iVar13 = iVar13 + -1;
          if (0.0 < dVar18) {
            uVar9 = (ulong)((int)uVar9 + 1);
          }
        }
        pbVar16 = pbVar15 + 1;
        pbVar15 = pbVar15 + 1;
        uVar11 = (uint)*pbVar16;
      }
      iVar10 = 0;
LAB_0010825e:
      if (bVar6) {
        dVar18 = internal::StrtodNormalPrecision(dVar18,iVar10 + iVar13);
        if (bVar2 == 0x2d) {
          dVar18 = -dVar18;
        }
        bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Double(handler,dVar18);
      }
      else if (bVar5) {
        if (bVar2 == 0x2d) {
          bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Int64(handler,-i);
        }
        else {
          bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Uint64(handler,i);
        }
      }
      else if (bVar2 == 0x2d) {
        bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Int(handler,-i_00);
      }
      else {
        bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Uint(handler,i_00);
      }
      if (bVar17 != false) goto LAB_001082ce;
      uVar14 = 0x10;
      pbVar16 = pbVar3;
    }
  }
  else {
    iVar13 = 0;
LAB_0010814d:
    iVar10 = 0;
    if ((uVar11 | 0x20) != 0x65) goto LAB_0010825e;
    uVar9 = (ulong)i_00;
    if (bVar5) {
      uVar9 = i;
    }
    if (!bVar6) {
      auVar21._8_4_ = (int)(uVar9 >> 0x20);
      auVar21._0_8_ = uVar9;
      auVar21._12_4_ = 0x45300000;
      dVar18 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar7 = pbVar15[1];
    bVar17 = bVar7 != 0x2b;
    if ((bVar17) && (bVar7 != 0x2d)) {
      pbVar16 = pbVar15 + 1;
      bVar17 = false;
    }
    else {
      bVar7 = pbVar15[2];
      pbVar16 = pbVar15 + 2;
    }
    if ((byte)(bVar7 - 0x30) < 10) {
      pbVar15 = pbVar16 + 1;
      iVar8 = bVar7 - 0x30;
      pbVar16 = pbVar15;
      if (bVar17) {
        while (pbVar15 = pbVar16, (byte)(*pbVar15 - 0x30) < 10) {
          iVar8 = iVar8 * 10 + (uint)*pbVar15 + -0x30;
          pbVar16 = pbVar15 + 1;
          if (0xccccccb < iVar8) {
            do {
              pbVar1 = pbVar15 + 1;
              pbVar15 = pbVar15 + 1;
              pbVar16 = pbVar15;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
        }
LAB_00108255:
        iVar10 = -iVar8;
        if (!bVar17) {
          iVar10 = iVar8;
        }
        goto LAB_0010825e;
      }
      do {
        bVar7 = *pbVar15;
        if (9 < (byte)(bVar7 - 0x30)) goto LAB_00108255;
        pbVar15 = pbVar15 + 1;
        iVar8 = iVar8 * 10 + (uint)bVar7 + -0x30;
      } while (iVar8 <= 0x134 - iVar13);
      uVar14 = 0xd;
      pbVar16 = pbVar3;
    }
    else {
      uVar14 = 0xf;
      pbVar15 = pbVar16;
    }
  }
LAB_0010823e:
  *(undefined4 *)(this + 0x30) = uVar14;
  *(long *)(this + 0x38) = (long)pbVar16 - (long)pCVar4;
LAB_001082ce:
  is->src_ = (Ch *)pbVar15;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            useNanOrInf = true;
            if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N'))) {
                d = std::numeric_limits<double>::quiet_NaN();
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f'))) {
                d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                            && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }